

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeWriter.cpp
# Opt level: O2

uint32 __thiscall
Js::WasmByteCodeWriter::WasmLoopStart
          (WasmByteCodeWriter *this,ByteCodeLabel loopEntrance,RegSlot *curRegs)

{
  int *piVar1;
  code *pcVar2;
  bool bVar3;
  uint loopId;
  undefined4 *puVar4;
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  LoopHeaderData local_3c;
  
  loopId = FunctionBody::IncrLoopCount((this->super_ByteCodeWriter).m_functionWrite);
  this_00 = (this->super_ByteCodeWriter).m_loopHeaders;
  if ((this_00->
      super_ReadOnlyList<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_DefaultComparer>
      ).count != loopId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/WasmByteCodeWriter.cpp"
                                ,0x2f,"((uint)m_loopHeaders->Count() == loopId)",
                                "(uint)m_loopHeaders->Count() == loopId");
    if (!bVar3) goto LAB_00744667;
    *puVar4 = 0;
    this_00 = (this->super_ByteCodeWriter).m_loopHeaders;
  }
  local_3c.startOffset = (this->super_ByteCodeWriter).m_byteCodeData.currentOffset;
  local_3c.isNested = 0 < (this->super_ByteCodeWriter).m_loopNest;
  local_3c.endOffset = 0;
  local_3c.hasYield = false;
  JsUtil::
  List<Js::ByteCodeWriter::LoopHeaderData,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(this_00,&local_3c);
  piVar1 = &(this->super_ByteCodeWriter).m_loopNest;
  *piVar1 = *piVar1 + 1;
  (*(this->super_IWasmByteCodeWriter)._vptr_IWasmByteCodeWriter[6])(this,(ulong)(uint)loopEntrance);
  bVar3 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,WasmLoopBodyStart,loopId,curRegs);
  if (!bVar3) {
    bVar3 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,WasmLoopBodyStart,loopId,curRegs);
    if (!bVar3) {
      bVar3 = TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,WasmLoopBodyStart,loopId,curRegs);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/WasmByteCodeWriter.cpp"
                                    ,0x34,"(success)","success");
        if (!bVar3) {
LAB_00744667:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar4 = 0;
      }
    }
  }
  return loopId;
}

Assistant:

uint32 WasmByteCodeWriter::WasmLoopStart(ByteCodeLabel loopEntrance, __in_ecount(WAsmJs::LIMIT) RegSlot* curRegs)
{
    uint loopId = m_functionWrite->IncrLoopCount();
    Assert((uint)m_loopHeaders->Count() == loopId);

    m_loopHeaders->Add(LoopHeaderData(m_byteCodeData.GetCurrentOffset(), 0, m_loopNest > 0, false));
    m_loopNest++;
    this->MarkAsmJsLabel(loopEntrance);
    MULTISIZE_LAYOUT_WRITE(WasmLoopStart, Js::OpCodeAsmJs::WasmLoopBodyStart, loopId, curRegs);

    return loopId;
}